

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O1

void __thiscall ProductFormUpdate::btran(ProductFormUpdate *this,HVector *rhs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer piVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  
  if ((this->valid_ == true) && (0 < (long)this->update_count_)) {
    piVar5 = (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)this->update_count_;
    do {
      iVar2 = piVar5[lVar13 + -1];
      dVar1 = pdVar8[iVar2];
      iVar3 = piVar9[lVar13 + -1];
      lVar14 = (long)iVar3;
      iVar4 = piVar9[lVar13];
      dVar16 = dVar1;
      if (iVar3 < iVar4) {
        do {
          dVar16 = dVar16 - pdVar10[lVar14] * pdVar8[piVar11[lVar14]];
          lVar14 = lVar14 + 1;
        } while (iVar4 != lVar14);
      }
      dVar16 = dVar16 / pdVar6[lVar13 + -1];
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        iVar3 = rhs->count;
        rhs->count = iVar3 + 1;
        piVar7[iVar3] = iVar2;
      }
      uVar15 = -(ulong)(ABS(dVar16) < 1e-14);
      pdVar8[iVar2] = (double)(~uVar15 & (ulong)dVar16 | uVar15 & 0x2b2bff2ee48e0530);
      bVar12 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar12);
  }
  return;
}

Assistant:

void ProductFormUpdate::btran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  for (HighsInt iX = update_count_ - 1; iX >= 0; iX--) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++)
      pivot_value -= value_[iEl] * rhs.array[index_[iEl]];
    pivot_value /= pivot_value_[iX];
    if (rhs.array[pivot_index] == 0) rhs.index[rhs.count++] = pivot_index;
    rhs.array[pivot_index] =
        (fabs(pivot_value) < kHighsTiny) ? 1e-100 : pivot_value;
  }
}